

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O0

ssize_t __thiscall PosixSerialPort::write(PosixSerialPort *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  int res;
  int len_local;
  uint8_t *buffer_local;
  PosixSerialPort *this_local;
  
  if (this->_devfd == -1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    sVar1 = ::write(this->_devfd,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf);
    this_local._4_4_ = (uint)sVar1;
    if ((this->_autoFlush & 1U) != 0) {
      (*(this->super_SerialPort)._vptr_SerialPort[10])();
    }
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int
PosixSerialPort::write(const uint8_t* buffer, int len)
{
    if (_devfd == -1)
        return -1;

    int res = ::write(_devfd, buffer, len);
    // Used on macos to avoid upload errors
    if (_autoFlush)
        flush();
    return res;
}